

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)

{
  ALLEGRO_BITMAP *pAVar1;
  ALLEGRO_DISPLAY *pAVar2;
  ALLEGRO_BITMAP *in_RDI;
  ALLEGRO_BITMAP *local_18;
  
  if (in_RDI != (ALLEGRO_BITMAP *)0x0) {
    local_18 = in_RDI;
    pAVar1 = al_get_target_bitmap();
    if (pAVar1 == in_RDI) {
      pAVar2 = al_get_current_display();
      if (pAVar2 == (ALLEGRO_DISPLAY *)0x0) {
        pAVar1 = (ALLEGRO_BITMAP *)0x0;
      }
      else {
        pAVar1 = al_get_backbuffer(pAVar2);
      }
      al_set_target_bitmap(pAVar1);
    }
    _al_set_bitmap_shader_field(in_RDI,(ALLEGRO_SHADER *)0x0);
    _al_unregister_destructor(_al_dtor_list,in_RDI->dtor_item);
    if (in_RDI->parent == (ALLEGRO_BITMAP *)0x0) {
      if ((in_RDI->_flags & 1) != 0) {
        _al_unregister_convert_bitmap((ALLEGRO_BITMAP *)0x1413b3);
        if (in_RDI->memory != (uchar *)0x0) {
          al_free_with_context
                    (in_RDI->memory,0x5b,
                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                     ,"destroy_memory_bitmap");
        }
        al_free_with_context
                  (in_RDI,0x5c,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                   ,"destroy_memory_bitmap");
        return;
      }
      pAVar2 = in_RDI->_display;
      if (in_RDI->locked == true) {
        al_unlock_bitmap(in_RDI);
      }
      if (in_RDI->vt != (ALLEGRO_BITMAP_INTERFACE *)0x0) {
        (*in_RDI->vt->destroy_bitmap)(in_RDI);
      }
      if (pAVar2 != (ALLEGRO_DISPLAY *)0x0) {
        _al_vector_find_and_delete(&pAVar2->bitmaps,&local_18);
        in_RDI = local_18;
      }
      if (in_RDI->memory != (uchar *)0x0) {
        al_free_with_context
                  (in_RDI->memory,0xf5,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                   ,"al_destroy_bitmap");
        in_RDI = local_18;
      }
    }
    al_free_with_context
              (in_RDI,0xf8,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
               ,"al_destroy_bitmap");
  }
  return;
}

Assistant:

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)
{
   if (!bitmap) {
      return;
   }

   /* As a convenience, implicitly untarget the bitmap on the calling thread
    * before it is destroyed, but maintain the current display.
    */
   if (bitmap == al_get_target_bitmap()) {
      ALLEGRO_DISPLAY *display = al_get_current_display();
      if (display)
         al_set_target_bitmap(al_get_backbuffer(display));
      else
         al_set_target_bitmap(NULL);
   }

   _al_set_bitmap_shader_field(bitmap, NULL);

   _al_unregister_destructor(_al_dtor_list, bitmap->dtor_item);

   if (!al_is_sub_bitmap(bitmap)) {
      ALLEGRO_DISPLAY* disp = _al_get_bitmap_display(bitmap);
      if (al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) {
         destroy_memory_bitmap(bitmap);
         return;
      }

      /* Else it's a display bitmap */

      if (bitmap->locked)
         al_unlock_bitmap(bitmap);

      if (bitmap->vt)
         bitmap->vt->destroy_bitmap(bitmap);

      if (disp)
         _al_vector_find_and_delete(&disp->bitmaps, &bitmap);

      if (bitmap->memory)
         al_free(bitmap->memory);
   }

   al_free(bitmap);
}